

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPostDepthCoverageTests.cpp
# Opt level: O0

IterateResult __thiscall gl4cts::PostDepthSampleMaskCase::iterate(PostDepthSampleMaskCase *this)

{
  void **ppvVar1;
  glUseProgramFunc p_Var2;
  glUniform1iFunc p_Var3;
  glGetUniformLocationFunc p_Var4;
  bool bVar5;
  int iVar6;
  GLenum GVar7;
  deUint32 dVar8;
  GLint GVar9;
  RenderContext *pRVar10;
  undefined4 extraout_var;
  TestLog *pTVar11;
  MessageBuilder *pMVar12;
  ShaderInfo *pSVar13;
  ProgramInfo *pPVar14;
  VertexArrayBinding *local_1258;
  VertexArrayBinding *local_1228;
  VertexArrayBinding *local_1210;
  bool local_11dd;
  char *local_f98;
  char *local_f90;
  MessageBuilder local_f88;
  int local_e08;
  int local_e04;
  int n_1;
  int n;
  int i_1;
  GLboolean compiledMask [4];
  GLubyte pixels [16];
  PrimitiveList local_de0;
  PrimitiveList local_dc8;
  PrimitiveList local_db0;
  float local_d94;
  float local_d90;
  GLfloat samplePos [2];
  GLint i;
  GLboolean expectedMask [4];
  GLint program;
  int pdcCase;
  int bufferCase;
  undefined1 local_bf8 [8];
  ShaderProgram program2;
  ProgramSources sources2;
  undefined1 local_8d8 [8];
  ShaderProgram program1b;
  ProgramSources sources1b;
  MessageBuilder local_730;
  undefined1 local_5b0 [8];
  ShaderProgram program1a;
  ProgramSources sources1a;
  string local_408;
  allocator<char> local_3e1;
  string local_3e0;
  void **local_3c0;
  undefined1 local_3b8 [8];
  VertexArrayBinding vertexArraysPost [2];
  allocator<char> local_309;
  string local_308;
  allocator<char> local_2e1;
  string local_2e0;
  void **local_2c0;
  undefined1 local_2b8 [8];
  VertexArrayBinding vertexArraysFar [2];
  allocator<char> local_209;
  string local_208;
  allocator<char> local_1d1;
  string local_1d0;
  void **local_1b0;
  undefined1 local_1a8 [8];
  VertexArrayBinding vertexArraysNear [2];
  GLuint indicesPost [6];
  deUint32 local_e8 [2];
  GLuint indicesPre [3];
  GLfloat verticesPost [12];
  GLfloat verticesFar [9];
  float afStack_78 [2];
  GLfloat verticesNear [9];
  float afStack_48 [2];
  GLfloat texCoord [8];
  Functions *gl;
  PostDepthSampleMaskCase *this_local;
  Functions *gl_00;
  
  pRVar10 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar6 = (*pRVar10->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar6);
  texCoord[2] = 0.0;
  texCoord[3] = 1.0;
  texCoord[4] = 1.0;
  texCoord[5] = 1.0;
  afStack_48[0] = 0.0;
  afStack_48[1] = 0.0;
  texCoord[0] = 1.0;
  texCoord[1] = 0.0;
  verticesNear[2] = -1.0;
  verticesNear[3] = 0.25;
  verticesNear[4] = -1.0;
  verticesNear[5] = 0.4;
  afStack_78[0] = -1.0;
  afStack_78[1] = -1.0;
  verticesNear[0] = 0.25;
  verticesNear[1] = 0.4;
  verticesNear[6] = 0.25;
  verticesPost[10] = -1.0;
  verticesPost[0xb] = -1.0;
  verticesPost[6] = 0.0;
  verticesPost[7] = 1.0;
  verticesPost[8] = 1.0;
  verticesPost[9] = 0.0;
  verticesPost[2] = -1.0;
  verticesPost[3] = 0.0;
  verticesPost[4] = -1.0;
  verticesPost[5] = 1.0;
  stack0xffffffffffffff28 = 0xbf800000bf800000;
  verticesPost[0] = 0.0;
  verticesPost[1] = 1.0;
  local_e8[0] = 0;
  local_e8[1] = 1;
  indicesPre[0] = 2;
  vertexArraysNear[1].pointer.data = (void *)0x100000000;
  local_1b0 = (void **)local_1a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"vertex",&local_1d1);
  glu::va::Float((VertexArrayBinding *)local_1a8,&local_1d0,3,3,0,afStack_78);
  ppvVar1 = &vertexArraysNear[0].pointer.data;
  local_1b0 = ppvVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"inTexCoord",&local_209);
  glu::va::Float((VertexArrayBinding *)ppvVar1,&local_208,2,3,0,afStack_48);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator(&local_209);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  local_2c0 = (void **)local_2b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e0,"vertex",&local_2e1);
  glu::va::Float((VertexArrayBinding *)local_2b8,&local_2e0,3,3,0,verticesPost + 10);
  ppvVar1 = &vertexArraysFar[0].pointer.data;
  local_2c0 = ppvVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_308,"inTexCoord",&local_309);
  glu::va::Float((VertexArrayBinding *)ppvVar1,&local_308,2,3,0,afStack_48);
  std::__cxx11::string::~string((string *)&local_308);
  std::allocator<char>::~allocator(&local_309);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::allocator<char>::~allocator(&local_2e1);
  sources1a._206_1_ = 1;
  local_3c0 = (void **)local_3b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e0,"vertex",&local_3e1);
  glu::va::Float((VertexArrayBinding *)local_3b8,&local_3e0,3,4,0,(float *)(indicesPre + 2));
  ppvVar1 = &vertexArraysPost[0].pointer.data;
  local_3c0 = ppvVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_408,"inTexCoord",(allocator<char> *)&sources1a.field_0xcf);
  glu::va::Float((VertexArrayBinding *)ppvVar1,&local_408,2,4,0,afStack_48);
  sources1a._206_1_ = 0;
  std::__cxx11::string::~string((string *)&local_408);
  std::allocator<char>::~allocator((allocator<char> *)&sources1a.field_0xcf);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::allocator<char>::~allocator(&local_3e1);
  glu::makeVtxFragSources
            ((ProgramSources *)&program1a.m_program.m_info.linkTimeUs,&this->m_vertShader,
             &this->m_fragShader1a);
  glu::ShaderProgram::ShaderProgram
            ((ShaderProgram *)local_5b0,gl_00,
             (ProgramSources *)&program1a.m_program.m_info.linkTimeUs);
  bVar5 = glu::ShaderProgram::isOk((ShaderProgram *)local_5b0);
  if (bVar5) {
    glu::makeVtxFragSources
              ((ProgramSources *)&program1b.m_program.m_info.linkTimeUs,&this->m_vertShader,
               &this->m_fragShader1b);
    glu::ShaderProgram::ShaderProgram
              ((ShaderProgram *)local_8d8,gl_00,
               (ProgramSources *)&program1b.m_program.m_info.linkTimeUs);
    bVar5 = glu::ShaderProgram::isOk((ShaderProgram *)local_8d8);
    if (bVar5) {
      glu::makeVtxFragSources
                ((ProgramSources *)&program2.m_program.m_info.linkTimeUs,&this->m_vertShader,
                 &this->m_fragShader2);
      glu::ShaderProgram::ShaderProgram
                ((ShaderProgram *)local_bf8,gl_00,
                 (ProgramSources *)&program2.m_program.m_info.linkTimeUs);
      bVar5 = glu::ShaderProgram::isOk((ShaderProgram *)local_bf8);
      if (bVar5) {
        (*gl_00->clearColor)(0.0,0.0,0.0,0.0);
        (*gl_00->clearStencil)(0);
        for (program = 0; program < 2; program = program + 1) {
          expectedMask[0] = '\0';
          expectedMask[1] = '\0';
          expectedMask[2] = '\0';
          expectedMask[3] = '\0';
          for (; (int)expectedMask < 2; expectedMask = (GLboolean  [4])((int)expectedMask + 1)) {
            i = 0;
            if (expectedMask == (GLboolean  [4])0x0) {
              i = glu::ShaderProgram::getProgram((ShaderProgram *)local_5b0);
            }
            else if (expectedMask == (GLboolean  [4])0x1) {
              i = glu::ShaderProgram::getProgram((ShaderProgram *)local_8d8);
            }
            (*gl_00->useProgram)(i);
            (*gl_00->bindFramebuffer)(0x8d40,this->m_framebufferMS);
            (*gl_00->viewport)(0,0,1,1);
            (*gl_00->enable)(0x809d);
            for (samplePos[0] = 0.0; (int)samplePos[0] < 4;
                samplePos[0] = (GLfloat)((int)samplePos[0] + 1)) {
              (*gl_00->getMultisamplefv)(0x8e50,(GLuint)samplePos[0],&local_d94);
              GVar7 = (*gl_00->getError)();
              glu::checkError(GVar7,"glGetMultisamplefv",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cPostDepthCoverageTests.cpp"
                              ,0x1aa);
              if ((expectedMask != (GLboolean  [4])0x1) || (0.7 <= local_d94 + local_d90)) {
                *(undefined1 *)((long)samplePos + (long)(int)samplePos[0] + 4) = 1;
              }
              else {
                *(undefined1 *)((long)samplePos + (long)(int)samplePos[0] + 4) = 0;
              }
            }
            if (program == 0) {
              (*gl_00->enable)(0xb71);
            }
            else if (program == 1) {
              (*gl_00->enable)(0xb90);
            }
            (*gl_00->clear)(0x4500);
            if (program == 1) {
              (*gl_00->stencilFunc)(0x207,1,0xff);
              (*gl_00->stencilOp)(0,0x1e01,0x1e01);
              (*gl_00->stencilMask)(0xff);
            }
            pRVar10 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
            glu::pr::TriangleStrip(&local_db0,3,local_e8);
            glu::draw(pRVar10,i,2,(VertexArrayBinding *)local_1a8,&local_db0,(DrawUtilCallback *)0x0
                     );
            (*gl_00->clear)(0x4000);
            if (program == 1) {
              (*gl_00->stencilFunc)(0x205,1,0xff);
              (*gl_00->stencilMask)(0);
            }
            pRVar10 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
            glu::pr::TriangleStrip(&local_dc8,3,local_e8);
            glu::draw(pRVar10,i,2,(VertexArrayBinding *)local_2b8,&local_dc8,(DrawUtilCallback *)0x0
                     );
            (*gl_00->disable)(0xb71);
            if (program == 0) {
              (*gl_00->disable)(0xb71);
            }
            else if (program == 1) {
              (*gl_00->disable)(0xb90);
            }
            (*gl_00->bindFramebuffer)(0x8d40,0);
            p_Var2 = gl_00->useProgram;
            dVar8 = glu::ShaderProgram::getProgram((ShaderProgram *)local_bf8);
            (*p_Var2)(dVar8);
            (*gl_00->bindFramebuffer)(0x8d40,this->m_framebuffer);
            (*gl_00->viewport)(0,0,1,4);
            (*gl_00->activeTexture)(0x84c0);
            (*gl_00->bindTexture)(0x9100,this->m_textureMS);
            p_Var3 = gl_00->uniform1i;
            p_Var4 = gl_00->getUniformLocation;
            dVar8 = glu::ShaderProgram::getProgram((ShaderProgram *)local_bf8);
            GVar9 = (*p_Var4)(dVar8,"texture");
            (*p_Var3)(GVar9,0);
            (*gl_00->clear)(0x4500);
            pRVar10 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
            dVar8 = glu::ShaderProgram::getProgram((ShaderProgram *)local_bf8);
            glu::pr::TriangleStrip(&local_de0,6,(deUint32 *)&vertexArraysNear[1].pointer.data);
            glu::draw(pRVar10,dVar8,2,(VertexArrayBinding *)local_3b8,&local_de0,
                      (DrawUtilCallback *)0x0);
            (*gl_00->disable)(0x809d);
            ::deMemset(&i_1,0,0x10);
            (*gl_00->readPixels)(0,0,1,4,0x1908,0x1401,&i_1);
            GVar7 = (*gl_00->getError)();
            glu::checkError(GVar7,"glReadPixels",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cPostDepthCoverageTests.cpp"
                            ,0x1ee);
            ::deMemset(&n,0,4);
            for (n_1 = 0; n_1 < 4; n_1 = n_1 + 1) {
              for (local_e04 = 0; local_e04 < 4; local_e04 = local_e04 + 1) {
                local_11dd = true;
                if (*(char *)((long)&n + (long)local_e04) == '\0') {
                  local_11dd = compiledMask[(long)(n_1 * 4 + local_e04) + -4] != '\0';
                }
                *(bool *)((long)&n + (long)local_e04) = local_11dd;
              }
            }
            for (local_e08 = 0; local_e08 < 4; local_e08 = local_e08 + 1) {
              if (*(char *)((long)samplePos + (long)local_e08 + 4) !=
                  *(char *)((long)&n + (long)local_e08)) {
                tcu::TestContext::setTestResult
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                           QP_TEST_RESULT_FAIL,"Fail");
                pTVar11 = tcu::TestContext::getLog
                                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
                ;
                tcu::TestLog::operator<<
                          (&local_f88,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
                pMVar12 = tcu::MessageBuilder::operator<<
                                    (&local_f88,(char (*) [19])"Wrong results for ");
                local_f90 = "BUFFERCASE_DEPTH_STENCIL";
                if (program == 0) {
                  local_f90 = "BUFFERCASE_DEPTH";
                }
                pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_f90);
                pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [4])0x2b9720c);
                local_f98 = "PDCCASE_ENABLED";
                if (expectedMask == (GLboolean  [4])0x0) {
                  local_f98 = "PDCCASE_DISABLED";
                }
                pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_f98);
                tcu::MessageBuilder::operator<<
                          (pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
                tcu::MessageBuilder::~MessageBuilder(&local_f88);
                goto LAB_011aba77;
              }
            }
          }
        }
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_PASS,"Pass");
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Shader program fail (samples reader).");
        pTVar11 = tcu::TestContext::getLog
                            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<
                  ((MessageBuilder *)&pdcCase,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar12 = tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)&pdcCase,(char (*) [9])0x2a53339);
        pSVar13 = glu::ShaderProgram::getShaderInfo((ShaderProgram *)local_bf8,SHADERTYPE_VERTEX,0);
        pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&pSVar13->infoLog);
        pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [2])0x2b9e07b);
        pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [11])"Fragment: ");
        pSVar13 = glu::ShaderProgram::getShaderInfo
                            ((ShaderProgram *)local_bf8,SHADERTYPE_FRAGMENT,0);
        pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&pSVar13->infoLog);
        pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [2])0x2b9e07b);
        pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [10])"Program: ");
        pPVar14 = glu::ShaderProgram::getProgramInfo((ShaderProgram *)local_bf8);
        pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&pPVar14->infoLog);
        tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&pdcCase);
      }
LAB_011aba77:
      glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_bf8);
      glu::ProgramSources::~ProgramSources((ProgramSources *)&program2.m_program.m_info.linkTimeUs);
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Shader program fail (post_depth_coverage).");
      pTVar11 = tcu::TestContext::getLog
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)&sources2.separable,pTVar11,
                 (BeginMessageToken *)&tcu::TestLog::Message);
      pMVar12 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)&sources2.separable,
                           (char (*) [28])"PostDepthCoverage: enabled\n");
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [9])0x2a53339);
      pSVar13 = glu::ShaderProgram::getShaderInfo((ShaderProgram *)local_8d8,SHADERTYPE_VERTEX,0);
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&pSVar13->infoLog);
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [2])0x2b9e07b);
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [11])"Fragment: ");
      pSVar13 = glu::ShaderProgram::getShaderInfo((ShaderProgram *)local_8d8,SHADERTYPE_FRAGMENT,0);
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&pSVar13->infoLog);
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [2])0x2b9e07b);
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [10])"Program: ");
      pPVar14 = glu::ShaderProgram::getProgramInfo((ShaderProgram *)local_8d8);
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&pPVar14->infoLog);
      tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&sources2.separable);
    }
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_8d8);
    glu::ProgramSources::~ProgramSources((ProgramSources *)&program1b.m_program.m_info.linkTimeUs);
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Shader program fail (non post_depth_coverage).");
    pTVar11 = tcu::TestContext::getLog
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_730,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar12 = tcu::MessageBuilder::operator<<(&local_730,(char (*) [9])0x2a53339);
    pSVar13 = glu::ShaderProgram::getShaderInfo((ShaderProgram *)local_5b0,SHADERTYPE_VERTEX,0);
    pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&pSVar13->infoLog);
    pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [2])0x2b9e07b);
    pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [11])"Fragment: ");
    pSVar13 = glu::ShaderProgram::getShaderInfo((ShaderProgram *)local_5b0,SHADERTYPE_FRAGMENT,0);
    pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&pSVar13->infoLog);
    pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [2])0x2b9e07b);
    pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [10])"Program: ");
    pPVar14 = glu::ShaderProgram::getProgramInfo((ShaderProgram *)local_5b0);
    pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&pPVar14->infoLog);
    tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_730);
  }
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_5b0);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&program1a.m_program.m_info.linkTimeUs);
  local_1210 = (VertexArrayBinding *)&vertexArraysPost[1].pointer.data;
  do {
    local_1210 = local_1210 + -1;
    glu::VertexArrayBinding::~VertexArrayBinding(local_1210);
  } while (local_1210 != (VertexArrayBinding *)local_3b8);
  local_1228 = (VertexArrayBinding *)&vertexArraysFar[1].pointer.data;
  do {
    local_1228 = local_1228 + -1;
    glu::VertexArrayBinding::~VertexArrayBinding(local_1228);
  } while (local_1228 != (VertexArrayBinding *)local_2b8);
  local_1258 = (VertexArrayBinding *)&vertexArraysNear[1].pointer.data;
  do {
    local_1258 = local_1258 + -1;
    glu::VertexArrayBinding::~VertexArrayBinding(local_1258);
  } while (local_1258 != (VertexArrayBinding *)local_1a8);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult PostDepthSampleMaskCase::iterate()
{
	const Functions& gl = m_context.getRenderContext().getFunctions();

	const GLfloat texCoord[] = {
		0.0f, 0.0f, 1.0f, 0.0f, 0.0f, 1.0f, 1.0f, 1.0f,
	};

	const GLfloat verticesNear[] = {
		-1.0f, -1.0f, 0.25f, 0.4f, -1.0f, 0.25f, -1.0f, 0.4f, 0.25f,
	};

	const GLfloat verticesFar[] = {
		-1.0f, -1.0f, 0.75f, 3.0f, -1.0f, 0.75f, -1.0f, 3.0f, 0.75f,
	};

	const GLfloat verticesPost[] = {
		-1.0f, -1.0f, 0.0f, 1.0f, -1.0f, 0.0f, -1.0f, 1.0f, 0.0f, 1.0f, 1.0f, 0.0f,
	};

	const GLuint indicesPre[] = { 0, 1, 2 };

	const GLuint indicesPost[] = { 0, 1, 2, 1, 2, 3 };

	glu::VertexArrayBinding vertexArraysNear[] = { glu::va::Float("vertex", 3, 3, 0, verticesNear),
												   glu::va::Float("inTexCoord", 2, 3, 0, texCoord) };

	glu::VertexArrayBinding vertexArraysFar[] = { glu::va::Float("vertex", 3, 3, 0, verticesFar),
												  glu::va::Float("inTexCoord", 2, 3, 0, texCoord) };

	glu::VertexArrayBinding vertexArraysPost[] = { glu::va::Float("vertex", 3, 4, 0, verticesPost),
												   glu::va::Float("inTexCoord", 2, 4, 0, texCoord) };

	//Prepare shaders
	ProgramSources sources1a = makeVtxFragSources(m_vertShader, m_fragShader1a);
	ShaderProgram  program1a(gl, sources1a);

	if (!program1a.isOk())
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Shader program fail (non post_depth_coverage).");
		m_testCtx.getLog() << tcu::TestLog::Message << "Vertex: " << program1a.getShaderInfo(SHADERTYPE_VERTEX).infoLog
						   << "\n"
						   << "Fragment: " << program1a.getShaderInfo(SHADERTYPE_FRAGMENT).infoLog << "\n"
						   << "Program: " << program1a.getProgramInfo().infoLog << tcu::TestLog::EndMessage;
		return STOP;
	}

	ProgramSources sources1b = makeVtxFragSources(m_vertShader, m_fragShader1b);
	ShaderProgram  program1b(gl, sources1b);

	if (!program1b.isOk())
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Shader program fail (post_depth_coverage).");
		m_testCtx.getLog() << tcu::TestLog::Message << "PostDepthCoverage: enabled\n"
						   << "Vertex: " << program1b.getShaderInfo(SHADERTYPE_VERTEX).infoLog << "\n"
						   << "Fragment: " << program1b.getShaderInfo(SHADERTYPE_FRAGMENT).infoLog << "\n"
						   << "Program: " << program1b.getProgramInfo().infoLog << tcu::TestLog::EndMessage;
		return STOP;
	}

	ProgramSources sources2 = makeVtxFragSources(m_vertShader, m_fragShader2);
	ShaderProgram  program2(gl, sources2);

	if (!program2.isOk())
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Shader program fail (samples reader).");
		m_testCtx.getLog() << tcu::TestLog::Message << "Vertex: " << program2.getShaderInfo(SHADERTYPE_VERTEX).infoLog
						   << "\n"
						   << "Fragment: " << program2.getShaderInfo(SHADERTYPE_FRAGMENT).infoLog << "\n"
						   << "Program: " << program2.getProgramInfo().infoLog << tcu::TestLog::EndMessage;
		return STOP;
	}

	gl.clearColor(0.0f, 0.0f, 0.0f, 0.0f);
	gl.clearStencil(0);

	//Iterate through all cases
	for (int bufferCase = BUFFERCASE_FIRST; bufferCase <= BUFFERCASE_LAST; ++bufferCase)
		for (int pdcCase = PDCCASE_FIRST; pdcCase <= PDCCASE_LAST; ++pdcCase)
		{
			GLint program = 0;
			if (pdcCase == PDCCASE_DISABLED)
				program = program1a.getProgram();
			else if (pdcCase == PDCCASE_ENABLED)
				program = program1b.getProgram();

			gl.useProgram(program);

			//Firstible use multisampled framebuffer
			gl.bindFramebuffer(GL_FRAMEBUFFER, m_framebufferMS);
			gl.viewport(0, 0, 1, 1);

			gl.enable(GL_MULTISAMPLE);

			//Check which samples should be covered by first draw - calculate expected sample mask
			GLboolean expectedMask[4];

			for (GLint i = 0; i < 4; ++i)
			{
				GLfloat samplePos[2];
				gl.getMultisamplefv(GL_SAMPLE_POSITION, i, &samplePos[0]);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetMultisamplefv");
				if (pdcCase == PDCCASE_ENABLED && (samplePos[0] + samplePos[1]) < 0.7f)
					expectedMask[i] = false;
				else
					expectedMask[i] = true;
			}

			if (bufferCase == BUFFERCASE_DEPTH)
				gl.enable(GL_DEPTH_TEST);
			else if (bufferCase == BUFFERCASE_STENCIL)
				gl.enable(GL_STENCIL_TEST);

			gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);

			if (bufferCase == BUFFERCASE_STENCIL)
			{
				gl.stencilFunc(GL_ALWAYS, 1, 0xFF);
				gl.stencilOp(GL_ZERO, GL_REPLACE, GL_REPLACE);
				gl.stencilMask(0xFF);
			}

			//Draw near primitive
			glu::draw(m_context.getRenderContext(), program, DE_LENGTH_OF_ARRAY(vertexArraysNear), vertexArraysNear,
					  glu::pr::TriangleStrip(DE_LENGTH_OF_ARRAY(indicesPre), indicesPre));

			gl.clear(GL_COLOR_BUFFER_BIT);

			if (bufferCase == BUFFERCASE_STENCIL)
			{
				gl.stencilFunc(GL_NOTEQUAL, 1, 0xFF);
				gl.stencilMask(0x00);
			}

			//Draw far primitive
			glu::draw(m_context.getRenderContext(), program, DE_LENGTH_OF_ARRAY(vertexArraysFar), vertexArraysFar,
					  glu::pr::TriangleStrip(DE_LENGTH_OF_ARRAY(indicesPre), indicesPre));

			gl.disable(GL_DEPTH_TEST);
			if (bufferCase == BUFFERCASE_DEPTH)
				gl.disable(GL_DEPTH_TEST);
			else if (bufferCase == BUFFERCASE_STENCIL)
				gl.disable(GL_STENCIL_TEST);

			gl.bindFramebuffer(GL_FRAMEBUFFER, 0);

			gl.useProgram(program2.getProgram());

			gl.bindFramebuffer(GL_FRAMEBUFFER, m_framebuffer);
			gl.viewport(0, 0, 1, 4);

			//Pass multisampled texture as a uniform
			gl.activeTexture(GL_TEXTURE0);
			gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE, m_textureMS);
			gl.uniform1i(gl.getUniformLocation(program2.getProgram(), "texture"), 0);

			gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);

			//Draw multisampled texture to framebuffer
			glu::draw(m_context.getRenderContext(), program2.getProgram(), DE_LENGTH_OF_ARRAY(vertexArraysPost),
					  vertexArraysPost, glu::pr::TriangleStrip(DE_LENGTH_OF_ARRAY(indicesPost), indicesPost));

			gl.disable(GL_MULTISAMPLE);

			//Read data from framebuffer
			GLubyte pixels[4 * 4];
			deMemset(pixels, 0, 4 * 4);

			gl.readPixels(0, 0, 1, 4, GL_RGBA, GL_UNSIGNED_BYTE, pixels);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels");

			//Verify the result
			GLboolean compiledMask[4];
			deMemset(compiledMask, 0, 4);
			for (int i = 0; i < 4; ++i)
			{
				for (int n			= 0; n < 4; ++n)
					compiledMask[n] = compiledMask[n] || (pixels[4 * i + n] != 0);
			}

			for (int n = 0; n < 4; ++n)
			{
				if (expectedMask[n] != compiledMask[n])
				{
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
					m_testCtx.getLog() << tcu::TestLog::Message << "Wrong results for "
									   << (bufferCase == BUFFERCASE_DEPTH ? "BUFFERCASE_DEPTH" :
																			"BUFFERCASE_DEPTH_STENCIL")
									   << " / "
									   << (pdcCase == PDCCASE_DISABLED ? "PDCCASE_DISABLED" : "PDCCASE_ENABLED")
									   << tcu::TestLog::EndMessage;
					return STOP;
				}
			}
		}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}